

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

bool __thiscall
VmaDefragmentationContext_T::ComputeDefragmentation
          (VmaDefragmentationContext_T *this,VmaBlockVector *vector,size_t index)

{
  uint32_t uVar1;
  VmaBlockMetadata *pVVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  CounterStatus CVar6;
  VkResult VVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  VkDeviceSize VVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  byte bVar9;
  VmaAllocHandle pVVar10;
  ulong uVar11;
  size_t sVar12;
  byte *pbVar13;
  long lVar14;
  ulong uStack_b0;
  VkDeviceSize VStack_a8;
  undefined8 uStack_a0;
  VmaAllocation_T *pVStack_90;
  undefined8 uStack_88;
  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *pVStack_80;
  VmaDeviceMemoryBlock *pVStack_78;
  byte *pbStack_70;
  undefined1 auStack_68 [16];
  VmaRawList<VmaSuballocation> *pVStack_58;
  VmaListItem<VmaSuballocation> *pVStack_50;
  void *pvStack_48;
  uint64_t uStack_40;
  VmaAllocationRequestType VStack_38;
  VmaAllocHandle handle;
  
  uVar1 = this->m_Algorithm;
  if (uVar1 != 8) {
    if (uVar1 == 4) {
      uVar11 = (vector->m_Blocks).m_Count;
      pVStack_80 = &this->m_Moves;
      while( true ) {
        uVar11 = uVar11 - 1;
        pbStack_70 = (byte *)this->m_ImmovableBlockCount;
        if (uVar11 <= pbStack_70) break;
        pVStack_78 = (vector->m_Blocks).m_pArray[uVar11];
        pVVar2 = pVStack_78->m_pMetadata;
        iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
        pVVar10 = (VmaAllocHandle)CONCAT44(extraout_var_01,iVar5);
        while (pVVar10 != (VmaAllocHandle)0x0) {
          GetMoveData((MoveAllocationData *)&uStack_b0,pVVar10,pVVar2);
          if (((VmaDefragmentationContext_T *)pVStack_90->m_pUserData != this) &&
             (CVar6 = CheckCounters(this,pVStack_90->m_Size), CVar6 != Ignore)) {
            if (CVar6 == End) goto LAB_001a86fe;
            sVar12 = (this->m_Moves).m_Count;
            bVar4 = AllocInOtherBlock(this,0,uVar11,(MoveAllocationData *)&uStack_b0,vector);
            if (bVar4) goto LAB_001a86fe;
            VVar8 = VmaAllocation_T::GetOffset(pVStack_90);
            if (((VVar8 != 0) && (sVar12 == (this->m_Moves).m_Count)) &&
               (iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[6])(pVVar2),
               uStack_b0 <= CONCAT44(extraout_var_02,iVar5))) {
              pvStack_48 = (void *)0x0;
              uStack_40 = 0;
              pVStack_58 = (VmaRawList<VmaSuballocation> *)0x0;
              pVStack_50 = (VmaListItem<VmaSuballocation> *)0x0;
              VStack_38 = Normal;
              auStack_68._0_8_ = (VmaAllocHandle)0x0;
              auStack_68._8_8_ = 0;
              iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0x11])
                                (pVVar2,uStack_b0,VStack_a8,0,uStack_a0 & 0xffffffff,0x40000,
                                 auStack_68);
              if (((char)iVar5 != '\0') &&
                 (iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[9])(pVVar2,auStack_68._0_8_),
                 CONCAT44(extraout_var_03,iVar5) < VVar8)) {
                VVar7 = VmaBlockVector::CommitAllocationRequest
                                  (vector,(VmaAllocationRequest *)auStack_68,pVStack_78,VStack_a8,
                                   uStack_a0._4_4_,this,(VmaSuballocationType)uStack_a0,
                                   (VmaAllocation *)&uStack_88);
                if (VVar7 == VK_SUCCESS) {
                  VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_>::
                  push_back(pVStack_80,(VmaDefragmentationMove *)&stack0xffffffffffffff68);
                  bVar4 = IncrementCounters(this,uStack_b0);
                  if (bVar4) goto LAB_001a86fe;
                }
              }
            }
          }
          iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,pVVar10);
          pVVar10 = (VmaAllocHandle)CONCAT44(extraout_var_04,iVar5);
        }
      }
LAB_001a86fe:
      return pbStack_70 < uVar11;
    }
    if (uVar1 != 1) {
      bVar4 = ComputeDefragmentation_Balanced(this,vector,index,true);
      return bVar4;
    }
    pVVar10 = (VmaAllocHandle)(vector->m_Blocks).m_Count;
    while( true ) {
      pVVar10 = pVVar10 + -1;
      auStack_68._0_8_ = this->m_ImmovableBlockCount;
      if (pVVar10 <= (ulong)auStack_68._0_8_) break;
      pVVar2 = (vector->m_Blocks).m_pArray[(long)pVVar10]->m_pMetadata;
      pbStack_70 = (byte *)0x1a8208;
      iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
      handle = (VmaAllocHandle)CONCAT44(extraout_var,iVar5);
      while (handle != (VmaAllocHandle)0x0) {
        pbStack_70 = (byte *)0x1a821e;
        GetMoveData((MoveAllocationData *)(auStack_68 + 8),handle,pVVar2);
        if (*(VmaDefragmentationContext_T **)(uStack_40 + 0x38) != this) {
          pbStack_70 = (byte *)0x1a8235;
          CVar6 = CheckCounters(this,*(VkDeviceSize *)(uStack_40 + 0x30));
          if (CVar6 != Ignore) {
            if (CVar6 == End) goto LAB_001a8269;
            pbStack_70 = (byte *)0x1a8252;
            bVar4 = AllocInOtherBlock(this,0,(size_t)pVVar10,(MoveAllocationData *)(auStack_68 + 8),
                                      vector);
            if (bVar4) goto LAB_001a8269;
          }
        }
        pbStack_70 = (byte *)0x1a8263;
        iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,handle);
        handle = (VmaAllocHandle)CONCAT44(extraout_var_00,iVar5);
      }
    }
LAB_001a8269:
    return (ulong)auStack_68._0_8_ < pVVar10;
  }
code_r0x001a8716:
  if (vector->m_BufferImageGranularity == 1) {
    bVar4 = ComputeDefragmentation_Full(this,vector);
    return bVar4;
  }
  pbVar13 = (byte *)((long)this->m_AlgorithmState + index * 0x10);
  bVar4 = false;
  uStack_88._7_1_ = '\0';
  uStack_88._6_1_ = '\0';
  uStack_88._5_1_ = '\0';
  bVar9 = *(byte *)((long)this->m_AlgorithmState + index * 0x10);
  switch(bVar9) {
  case 0:
  case 1:
  case 2:
    sVar12 = *(size_t *)(pbVar13 + 8);
    if (sVar12 == 0xffffffffffffffff) {
      sVar12 = (vector->m_Blocks).m_Count;
    }
    else if (sVar12 == 0) {
      *pbVar13 = 6;
      bVar4 = ComputeDefragmentation_Fast(this,vector);
      return bVar4;
    }
    pVStack_80 = (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)
                 (sVar12 - 1);
    pVVar2 = (vector->m_Blocks).m_pArray[sVar12 - 1]->m_pMetadata;
    auStack_68._0_8_ = (this->m_Moves).m_Count;
    uStack_a0._0_4_ = 0x1a87f2;
    uStack_a0._4_4_ = 0;
    pVStack_78 = (VmaDeviceMemoryBlock *)index;
    pbStack_70 = pbVar13;
    iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xb])(pVVar2);
    pVVar10 = (VmaAllocHandle)CONCAT44(extraout_var_05,iVar5);
    while (uVar3 = auStack_68._0_8_, pbVar13 = pbStack_70, pVVar10 != (VmaAllocHandle)0x0) {
      uStack_a0._0_4_ = 0x1a880d;
      uStack_a0._4_4_ = 0;
      GetMoveData((MoveAllocationData *)(auStack_68 + 8),pVVar10,pVVar2);
      uStack_a0._0_4_ = 0x1a881e;
      uStack_a0._4_4_ = 0;
      CVar6 = CheckCounters(this,*(VkDeviceSize *)(uStack_40 + 0x30));
      if (CVar6 != Ignore) {
        if (CVar6 == End) {
          return true;
        }
        uStack_a0._0_4_ = 0x1a8841;
        uStack_a0._4_4_ = 0;
        bVar4 = AllocInOtherBlock(this,0,(size_t)pVStack_80,(MoveAllocationData *)(auStack_68 + 8),
                                  vector);
        if (bVar4) {
          if ((VmaAllocHandle)auStack_68._0_8_ == (VmaAllocHandle)(this->m_Moves).m_Count) {
            return true;
          }
          uStack_a0._0_4_ = 0x1a894a;
          uStack_a0._4_4_ = 0;
          iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,pVVar10);
          if (CONCAT44(extraout_var_07,iVar5) != 0) {
            return true;
          }
          *(VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> **)
           ((long)this->m_AlgorithmState + (long)pVStack_78 * 8) = pVStack_80;
          return true;
        }
      }
      uStack_a0._0_4_ = 0x1a8856;
      uStack_a0._4_4_ = 0;
      iVar5 = (*pVVar2->_vptr_VmaBlockMetadata[0xc])(pVVar2,pVVar10);
      pVVar10 = (VmaAllocHandle)CONCAT44(extraout_var_06,iVar5);
    }
    if ((VmaAllocHandle)auStack_68._0_8_ == (VmaAllocHandle)(this->m_Moves).m_Count) {
      if (pVStack_80 !=
          (VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> *)0x0) {
        lVar14 = sVar12 - 2;
        while (lVar14 != 0) {
          uStack_a0._0_4_ = 0x1a88a2;
          uStack_a0._4_4_ = 0;
          bVar4 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[lVar14]);
          lVar14 = lVar14 + -1;
          if (bVar4) {
            return true;
          }
        }
        if ((VmaAllocHandle)uVar3 != (VmaAllocHandle)(this->m_Moves).m_Count) {
LAB_001a8a3d:
          bVar9 = *pbVar13;
switchD_001a8786_caseD_6:
          if (bVar9 == 6) {
LAB_001a8a46:
            sVar12 = (this->m_Moves).m_Count;
            uVar11 = 0;
            while (uVar11 < (vector->m_Blocks).m_Count) {
              uStack_a0._0_4_ = 0x1a8a6c;
              uStack_a0._4_4_ = 0;
              bVar4 = ReallocWithinBlock(this,vector,(vector->m_Blocks).m_pArray[uVar11]);
              uVar11 = uVar11 + 1;
              if (bVar4) {
                return true;
              }
            }
            if (sVar12 == (this->m_Moves).m_Count) {
              *pbVar13 = 7;
            }
          }
          return false;
        }
      }
      uStack_a0._0_4_ = 0x1a8a3b;
      uStack_a0._4_4_ = 0;
      bVar4 = ComputeDefragmentation_Fast(this,vector);
    }
    else {
      bVar9 = 3;
      if (*pbStack_70 != 0) {
        bVar9 = *pbStack_70 == 2 | 4;
      }
      *pbStack_70 = bVar9;
      *(VmaVector<VmaDefragmentationMove,_VmaStlAllocator<VmaDefragmentationMove>_> **)
       (pbStack_70 + 8) = pVStack_80;
      uStack_a0._0_4_ = 0x1a8929;
      uStack_a0._4_4_ = 0;
      bVar4 = ComputeDefragmentation_Extensive(this,vector,(size_t)pVStack_78);
    }
switchD_001a8786_caseD_7:
    return bVar4;
  case 3:
switchD_001a8786_caseD_3:
    uStack_88._6_1_ = '\0';
    uStack_88._5_1_ = '\0';
    uStack_a0 = 0x1a89b3;
    bVar4 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_BUFFER,vector,*(size_t *)(pbVar13 + 8),
                       (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                       (bool *)((long)&uStack_88 + 5));
    if (!bVar4) goto LAB_001a8a3d;
    if (uStack_88._6_1_ != '\x01') {
      if (uStack_88._5_1_ != '\x01') goto LAB_001a8a23;
      *pbVar13 = 5;
      goto switchD_001a8786_caseD_5;
    }
    break;
  case 4:
    uStack_a0 = 0x1a88d7;
    bVar4 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL,vector,*(size_t *)(pbVar13 + 8),
                       (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                       (bool *)((long)&uStack_88 + 5));
    if (!bVar4) goto LAB_001a8a3d;
    if (uStack_88._7_1_ != '\x01') {
      if ((uStack_88._6_1_ != '\0') || (uStack_88._5_1_ == '\x01')) {
        *pbVar13 = 3;
        goto switchD_001a8786_caseD_3;
      }
      goto LAB_001a8a23;
    }
    *pbVar13 = 1;
    goto code_r0x001a8716;
  case 5:
switchD_001a8786_caseD_5:
    uStack_88._5_1_ = '\0';
    uStack_a0 = 0x1a89f7;
    bVar4 = MoveDataToFreeBlocks
                      (this,VMA_SUBALLOCATION_TYPE_FREE,vector,*(size_t *)(pbVar13 + 8),
                       (bool *)((long)&uStack_88 + 7),(bool *)((long)&uStack_88 + 6),
                       (bool *)((long)&uStack_88 + 5));
    if (!bVar4) goto LAB_001a8a3d;
    if (uStack_88._5_1_ != '\x01') {
LAB_001a8a23:
      *pbVar13 = 6;
      goto LAB_001a8a46;
    }
    break;
  default:
    goto switchD_001a8786_caseD_6;
  case 7:
    goto switchD_001a8786_caseD_7;
  }
  *pbVar13 = 0;
  goto code_r0x001a8716;
}

Assistant:

bool VmaDefragmentationContext_T::ComputeDefragmentation(VmaBlockVector& vector, size_t index)
{
    switch (m_Algorithm)
    {
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FAST_BIT:
        return ComputeDefragmentation_Fast(vector);
    default:
        VMA_ASSERT(0);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_BALANCED_BIT:
        return ComputeDefragmentation_Balanced(vector, index, true);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_FULL_BIT:
        return ComputeDefragmentation_Full(vector);
    case VMA_DEFRAGMENTATION_FLAG_ALGORITHM_EXTENSIVE_BIT:
        return ComputeDefragmentation_Extensive(vector, index);
    }
}